

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.cc
# Opt level: O3

void CoreML::Specification::protobuf_NearestNeighbors_2eproto::AddDescriptors(void)

{
  FunctionClosure0 func;
  FunctionClosure0 local_20;
  
  if (AddDescriptors::once != 2) {
    local_20.super_Closure._vptr_Closure = (_func_int **)&PTR__FunctionClosure0_003c62a0;
    local_20.function_ = AddDescriptorsImpl;
    local_20.self_deleting_ = false;
    google::protobuf::GoogleOnceInitImpl(&AddDescriptors::once,&local_20.super_Closure);
    google::protobuf::internal::FunctionClosure0::~FunctionClosure0(&local_20);
  }
  return;
}

Assistant:

void KNearestNeighborsClassifier::clear_ClassLabels() {
// @@protoc_insertion_point(one_of_clear_start:CoreML.Specification.KNearestNeighborsClassifier)
  switch (ClassLabels_case()) {
    case kStringClassLabels: {
      delete ClassLabels_.stringclasslabels_;
      break;
    }
    case kInt64ClassLabels: {
      delete ClassLabels_.int64classlabels_;
      break;
    }
    case CLASSLABELS_NOT_SET: {
      break;
    }
  }
  _oneof_case_[0] = CLASSLABELS_NOT_SET;
}